

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::PrintExponent
               (int exp,char e,Buffer *out)

{
  Buffer *out_local;
  char e_local;
  int exp_local;
  
  Buffer::push_back(out,e);
  if (exp < 0) {
    Buffer::push_back(out,'-');
    out_local._4_4_ = -exp;
  }
  else {
    Buffer::push_back(out,'+');
    out_local._4_4_ = exp;
  }
  if (out_local._4_4_ < 100) {
    Buffer::push_back(out,(char)(out_local._4_4_ / 10) + '0');
    Buffer::push_back(out,(char)(out_local._4_4_ % 10) + '0');
  }
  else {
    Buffer::push_back(out,(char)(out_local._4_4_ / 100) + '0');
    Buffer::push_back(out,(char)((long)((ulong)(uint)((int)((long)out_local._4_4_ / 10) >> 0x1f) <<
                                        0x20 | (long)out_local._4_4_ / 10 & 0xffffffffU) % 10) + '0'
                     );
    Buffer::push_back(out,(char)(out_local._4_4_ % 10) + '0');
  }
  return;
}

Assistant:

void PrintExponent(int exp, char e, Buffer *out) {
  out->push_back(e);
  if (exp < 0) {
    out->push_back('-');
    exp = -exp;
  } else {
    out->push_back('+');
  }
  // Exponent digits.
  if (exp > 99) {
    out->push_back(static_cast<char>(exp / 100 + '0'));
    out->push_back(static_cast<char>(exp / 10 % 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  } else {
    out->push_back(static_cast<char>(exp / 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  }
}